

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCustomAttributes.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::Glorp>::writeValueTo
          (TypedAttribute<Imf_3_4::Glorp> *this,OStream *os,int version)

{
  undefined8 in_RAX;
  int local_18;
  int local_14;
  
  _local_18 = CONCAT44((int)((ulong)in_RAX >> 0x20),(this->_value).a);
  (**(code **)(*(long *)os + 0x10))(os,&local_18,4);
  _local_18 = CONCAT44((this->_value).b,local_18);
  (**(code **)(*(long *)os + 0x10))(os,&local_14,4);
  return;
}

Assistant:

void
GlorpAttribute::writeValueTo (OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value.a);
    Xdr::write<StreamIO> (os, _value.b);
}